

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_shuffle_8bytes(char *heap,LONGLONG length,int *status)

{
  void *__src;
  undefined1 *puVar1;
  int *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  undefined1 *local_38;
  long local_20;
  
  __src = calloc(1,in_RSI << 3);
  local_38 = in_RDI;
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    *(undefined1 *)((long)__src + local_20) = *local_38;
    puVar1 = (undefined1 *)((long)__src + local_20) + in_RSI;
    *puVar1 = local_38[1];
    puVar1 = puVar1 + in_RSI;
    *puVar1 = local_38[2];
    puVar1 = puVar1 + in_RSI;
    *puVar1 = local_38[3];
    puVar1 = puVar1 + in_RSI;
    *puVar1 = local_38[4];
    puVar1 = puVar1 + in_RSI;
    *puVar1 = local_38[5];
    puVar1[in_RSI] = local_38[6];
    (puVar1 + in_RSI)[in_RSI] = local_38[7];
    local_38 = local_38 + 8;
  }
  memcpy(in_RDI,__src,in_RSI << 3);
  free(__src);
  return *in_RDX;
}

Assistant:

static int fits_shuffle_8bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 8-byte integers or doubles in the heap */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = calloc(1, (size_t) (length * 8));
    heapptr = heap;
    
/* for some bizarre reason this loop fails to compile under OpenSolaris using
   the proprietary SunStudioExpress C compiler;  use the following equivalent
   loop instead.
   
    cptr = ptr;

    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       *(cptr + (length * 2)) = *heapptr;
       heapptr++;
       *(cptr + (length * 3)) = *heapptr;
       heapptr++;
       *(cptr + (length * 4)) = *heapptr;
       heapptr++;
       *(cptr + (length * 5)) = *heapptr;
       heapptr++;
       *(cptr + (length * 6)) = *heapptr;
       heapptr++;
       *(cptr + (length * 7)) = *heapptr;
       heapptr++;
       cptr++;
     }
*/
     for (ii = 0; ii < length; ii++) {
        cptr = ptr + ii;

        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
        cptr += length;
        *cptr = *heapptr;

        heapptr++;
     }
        
    memcpy(heap, ptr, (size_t) (length * 8));
    free(ptr);
 
    return(*status);
}